

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

void scp::_scp::cooleyTukeyRadix2<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size)

{
  ulong size_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  undefined1 local_a8 [8];
  complex<double> tmp_1;
  complex<double> *itEnd;
  complex<double> *it2;
  complex<double> *it;
  complex<double> local_60;
  undefined1 local_50 [8];
  complex<double> tmp;
  complex<double> *x1;
  complex<double> *x0;
  uint64_t size_local;
  uint64_t baseStride_local;
  complex<double> *base_local;
  uint64_t stride_local;
  complex<double> *beg_local;
  
  if (size == 2) {
    tmp._M_value._8_8_ = beg + stride;
    local_50 = *(undefined1 (*) [8])beg->_M_value;
    tmp._M_value._0_8_ = *(undefined8 *)(beg->_M_value + 8);
    std::operator*(base,(complex<double> *)tmp._M_value._8_8_);
    std::complex<double>::operator+=(beg,&local_60);
    std::operator*(base + baseStride,(complex<double> *)tmp._M_value._8_8_);
    std::operator+((complex<double> *)local_50,(complex<double> *)&it);
    *(undefined8 *)tmp._M_value._8_8_ = extraout_XMM0_Qa;
    *(undefined8 *)(tmp._M_value._8_8_ + 8) = in_XMM1_Qa;
  }
  else {
    size_00 = size >> 1;
    cooleyTukeyRadix2<std::complex<double>>(beg,stride,base,baseStride << 1,size_00);
    cooleyTukeyRadix2<std::complex<double>>
              (beg + size_00 * stride,stride,base,baseStride << 1,size_00);
    tmp_1._M_value._8_8_ = beg + size_00 * stride;
    itEnd = (complex<double> *)tmp_1._M_value._8_8_;
    baseStride_local = (uint64_t)base;
    for (it2 = beg; it2 != (complex<double> *)tmp_1._M_value._8_8_; it2 = it2 + stride) {
      std::operator*((complex<double> *)baseStride_local,itEnd);
      std::operator-(it2,(complex<double> *)local_a8);
      *(undefined8 *)itEnd->_M_value = extraout_XMM0_Qa_00;
      *(undefined8 *)(itEnd->_M_value + 8) = in_XMM1_Qa;
      std::complex<double>::operator+=(it2,(complex<double> *)local_a8);
      itEnd = itEnd + stride;
      baseStride_local = baseStride * 0x10 + baseStride_local;
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukeyRadix2(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size)
		{
			if (size == 2)
			{
				TValue& x0 = *beg;
				TValue& x1 = *(beg + stride);
				const TValue tmp = x0;
				x0 += *base * x1;
				x1 = tmp + *(base + baseStride) * x1;
			}
			else
			{
				size >>= 1;
				baseStride <<= 1;

				cooleyTukeyRadix2(beg, stride, base, baseStride, size);
				cooleyTukeyRadix2(beg + size * stride, stride, base, baseStride, size);

				baseStride >>= 1;

				TValue* it = beg;
				TValue* it2 = it + size * stride;
				const TValue* const itEnd = it2;
				for (; it != itEnd; it += stride, it2 += stride, base += baseStride)
				{
					TValue tmp = *base * *it2;
					*it2 = *it - tmp;
					*it += tmp;
				}
			}
		}